

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O3

void __thiscall
cmLocalUnixMakefileGenerator3::CreateCDCommand
          (cmLocalUnixMakefileGenerator3 *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *commands,string *tgtDir,string *relDir)

{
  size_t __n;
  pointer pbVar1;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *this_00;
  bool bVar2;
  int iVar3;
  long *plVar4;
  size_type *psVar5;
  char *__lhs;
  cmOutputConverter *this_01;
  pointer __rhs;
  pointer pcVar6;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  string prefix;
  string outputForExisting;
  string local_b8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_58;
  string local_50;
  
  __n = tgtDir->_M_string_length;
  if (__n == relDir->_M_string_length) {
    if (__n == 0) {
      return;
    }
    iVar3 = bcmp((tgtDir->_M_dataplus)._M_p,(relDir->_M_dataplus)._M_p,__n);
    if (iVar3 == 0) {
      return;
    }
  }
  bVar2 = cmLocalGenerator::IsMinGWMake((cmLocalGenerator *)this);
  __lhs = "cd ";
  if (bVar2) {
    __lhs = "cd /d ";
  }
  if (*(char *)((long)&(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator
                       [1].FindMakeProgramFile._M_string_length + 2) == '\0') {
    pcVar6 = (pointer)((ulong)bVar2 * 3 + 3);
    this_01 = &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter;
    local_58 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)commands;
    cmOutputConverter::ConvertToOutputForExisting(&local_b8,this_01,tgtDir,SHELL);
    local_78.field_2._M_allocated_capacity = local_b8._M_string_length;
    local_78.field_2._8_8_ = local_b8._M_dataplus._M_p;
    views._M_len = 2;
    views._M_array = (iterator)&local_78;
    local_78._M_dataplus._M_p = pcVar6;
    local_78._M_string_length = (size_type)__lhs;
    cmCatViews_abi_cxx11_(&local_98,views);
    this_00 = local_58;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::insert((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)this_00,
             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)this_00,
             &local_98);
    cmOutputConverter::ConvertToOutputForExisting(&local_50,this_01,relDir,SHELL);
    local_78.field_2._M_allocated_capacity = local_50._M_string_length;
    local_78.field_2._8_8_ = local_50._M_dataplus._M_p;
    views_00._M_len = 2;
    views_00._M_array = (iterator)&local_78;
    local_78._M_dataplus._M_p = pcVar6;
    local_78._M_string_length = (size_type)__lhs;
    cmCatViews_abi_cxx11_(&local_b8,views_00);
    std::__cxx11::string::operator=((string *)&local_98,(string *)&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>(this_00,&local_98);
  }
  else {
    cmOutputConverter::ConvertToOutputForExisting
              (&local_98,
               &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter,
               tgtDir,SHELL);
    std::operator+(&local_78,__lhs,&local_98);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_78);
    psVar5 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_b8.field_2._M_allocated_capacity = *psVar5;
      local_b8.field_2._8_8_ = plVar4[3];
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    }
    else {
      local_b8.field_2._M_allocated_capacity = *psVar5;
      local_b8._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_b8._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    __rhs = (commands->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
    pbVar1 = (commands->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (__rhs != pbVar1) {
      do {
        std::operator+(&local_78,&local_b8,__rhs);
        std::__cxx11::string::operator=((string *)__rhs,(string *)&local_78);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        __rhs = __rhs + 1;
      } while (__rhs != pbVar1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::CreateCDCommand(
  std::vector<std::string>& commands, std::string const& tgtDir,
  std::string const& relDir)
{
  // do we need to cd?
  if (tgtDir == relDir) {
    return;
  }

  // In a Windows shell we must change drive letter too.  The shell
  // used by NMake and Borland make does not support "cd /d" so this
  // feature simply cannot work with them (Borland make does not even
  // support changing the drive letter with just "d:").
  const char* cd_cmd = this->IsMinGWMake() ? "cd /d " : "cd ";

  cmGlobalUnixMakefileGenerator3* gg =
    static_cast<cmGlobalUnixMakefileGenerator3*>(this->GlobalGenerator);
  if (!gg->UnixCD) {
    // On Windows we must perform each step separately and then change
    // back because the shell keeps the working directory between
    // commands.
    std::string cmd =
      cmStrCat(cd_cmd, this->ConvertToOutputForExisting(tgtDir));
    commands.insert(commands.begin(), cmd);

    // Change back to the starting directory.
    cmd = cmStrCat(cd_cmd, this->ConvertToOutputForExisting(relDir));
    commands.push_back(std::move(cmd));
  } else {
    // On UNIX we must construct a single shell command to change
    // directory and build because make resets the directory between
    // each command.
    std::string outputForExisting = this->ConvertToOutputForExisting(tgtDir);
    std::string prefix = cd_cmd + outputForExisting + " && ";
    std::transform(commands.begin(), commands.end(), commands.begin(),
                   [&prefix](std::string const& s) { return prefix + s; });
  }
}